

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O3

int RqInterInit(int nK,int nMaxExtra,RqInterWorkMem *pInterWorkMem,size_t nInterWorkMemSize)

{
  int iVar1;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  if (nInterWorkMemSize < 0x34) {
    RqInterInit_cold_3();
  }
  else {
    parameters_get(nK);
    (pInterWorkMem->params).W = uStack_38;
    (pInterWorkMem->params).P = uStack_34;
    (pInterWorkMem->params).P1 = (undefined4)uStack_30;
    (pInterWorkMem->params).U = uStack_30._4_4_;
    (pInterWorkMem->params).S = (undefined4)local_44;
    (pInterWorkMem->params).H = local_44._4_4_;
    (pInterWorkMem->params).B = uStack_3c;
    (pInterWorkMem->params).W = uStack_38;
    (pInterWorkMem->params).K = (undefined4)local_54;
    (pInterWorkMem->params).Kprime = local_54._4_4_;
    (pInterWorkMem->params).J = (undefined4)uStack_4c;
    (pInterWorkMem->params).L = uStack_4c._4_4_;
    if ((pInterWorkMem->params).K == -1) {
      RqInterInit_cold_2();
      return -2;
    }
    iVar1 = (int)(nInterWorkMemSize + 0x3ffffffcc >> 2);
    pInterWorkMem->nESI_max = iVar1;
    if (nMaxExtra + nK <= iVar1) {
      pInterWorkMem->nESI = 0;
      return 0;
    }
    RqInterInit_cold_1();
  }
  return -1;
}

Assistant:

int RqInterInit(int nK,
		   int nMaxExtra,
		   RqInterWorkMem* pInterWorkMem,
		   size_t nInterWorkMemSize)
{
	if (nInterWorkMemSize < sizeof(RqInterWorkMem)) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}
	pInterWorkMem->params = parameters_get(nK);
	if (pInterWorkMem->params.K == -1) {
		errmsg("Unsupported K value.");
		return RQ_ERR_EDOM;
	}
	assert(pInterWorkMem->params.K == nK);
	pInterWorkMem->nESI_max
	  = (nInterWorkMemSize - sizeof(RqInterWorkMem)) / sizeof(uint32_t);
	if (pInterWorkMem->nESI_max < nK + nMaxExtra) {
		errmsg("Insufficient inter work memory size.");
		return RQ_ERR_ENOMEM;
	}

	pInterWorkMem->nESI = 0;
	return 0;
}